

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinifyImportsAndExports.cpp
# Opt level: O0

void __thiscall wasm::MinifyImportsAndExports::run(MinifyImportsAndExports *this,Module *module)

{
  size_t *this_00;
  size_t *this_01;
  anon_class_16_2_bbb8411c visitor;
  bool bVar1;
  reference this_02;
  pointer name;
  reference __in;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *__os;
  type *old;
  type *new_;
  _Self local_f0;
  iterator __end2;
  iterator __begin2;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *__range2;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range3;
  undefined1 local_98 [8];
  anon_class_24_3_374d5397 process;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  newToOld;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  oldToNew;
  MinifiedNameGenerator names;
  Module *module_local;
  MinifyImportsAndExports *this_local;
  
  this_00 = &oldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count;
  Names::MinifiedNameGenerator::MinifiedNameGenerator((MinifiedNameGenerator *)this_00);
  this_01 = &newToOld._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         *)this_01);
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         *)&process.newToOld);
  visitor.process = (anon_class_24_3_374d5397 *)local_98;
  visitor.this = this;
  local_98 = (undefined1  [8])this_01;
  process.oldToNew =
       (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
        *)this_00;
  process.names = (MinifiedNameGenerator *)&process.newToOld;
  wasm::ModuleUtils::
  iterImports<wasm::MinifyImportsAndExports::run(wasm::Module*)::_lambda(wasm::Importable*)_1_>
            (module,visitor);
  if ((this->minifyExports & 1U) != 0) {
    __end3 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&module->exports);
    curr = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
           std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::end(&module->exports);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                       *)&curr), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                ::operator*(&__end3);
      name = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_02);
      run::anon_class_24_3_374d5397::operator()((anon_class_24_3_374d5397 *)local_98,&name->name);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  Module::updateMaps(module);
  __end2 = std::
           map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           ::begin((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)&process.newToOld);
  local_f0._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::end((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              *)&process.newToOld);
  while (bVar1 = std::operator!=(&__end2,&local_f0), bVar1) {
    __in = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Name>_>::operator*(&__end2);
    pbVar2 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::get<0ul,wasm::Name_const,wasm::Name>(__in);
    pbVar3 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::get<1ul,wasm::Name_const,wasm::Name>(__in);
    pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,*pbVar3);
    __os = std::operator<<(pbVar4," => ");
    pbVar4 = std::operator<<(__os,*pbVar2);
    std::operator<<(pbVar4,'\n');
    std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::Name>_>::operator++(&__end2);
  }
  if ((this->minifyModules & 1U) != 0) {
    doMinifyModules(this,module);
  }
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          *)&process.newToOld);
  std::
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          *)&newToOld._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void run(Module* module) override {
    // Minify the imported names.
    Names::MinifiedNameGenerator names;
    std::map<Name, Name> oldToNew;
    std::map<Name, Name> newToOld;
    auto process = [&](Name& name) {
      auto iter = oldToNew.find(name);
      if (iter == oldToNew.end()) {
        auto newName = names.getName();
        oldToNew[name] = newName;
        newToOld[newName] = name;
        name = newName;
      } else {
        name = iter->second;
      }
    };
    ModuleUtils::iterImports(*module, [&](Importable* curr) {
      // Minify all import base names if we are importing modules (which means
      // we will minify all modules names, so we are not being careful).
      // Otherwise, assume we just want to minify "normal" imports like env
      // and wasi, but not custom user things.
      if (minifyModules || curr->module == ENV ||
          curr->module.startsWith("wasi_")) {
        process(curr->base);
      }
    });

    if (minifyExports) {
      // Minify the exported names.
      for (auto& curr : module->exports) {
        process(curr->name);
      }
    }
    module->updateMaps();
    // Emit the mapping.
    for (auto& [new_, old] : newToOld) {
      std::cout << old.str << " => " << new_.str << '\n';
    }

    if (minifyModules) {
      doMinifyModules(module);
    }
  }